

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

float frandGaussian(float mu,float sigma)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  bVar1 = *(byte *)(in_FS_OFFSET + -4);
  *(byte *)(in_FS_OFFSET + -4) = bVar1 ^ 1;
  if (bVar1 == 1) {
    fVar4 = *(float *)(in_FS_OFFSET + -8);
  }
  else {
    iVar2 = rand();
    iVar3 = rand();
    dVar5 = log((double)(1.0 - (float)iVar2 * 4.656613e-10));
    dVar5 = dVar5 * -2.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = (double)((float)iVar3 * 4.656613e-10 * 6.2831855);
    dVar7 = cos(dVar6);
    fVar4 = (float)(dVar7 * (double)(float)dVar5);
    dVar6 = sin(dVar6);
    *(float *)(in_FS_OFFSET + -8) = (float)(dVar6 * (double)(float)dVar5);
  }
  return fVar4 * sigma + mu;
}

Assistant:

float frandGaussian(float mu, float sigma) {
	static const float two_pi = 2.0*3.14159265358979323846;

	thread_local float z1;
	thread_local bool generate;
	generate = !generate;

	if (!generate)
	   return z1 * sigma + mu;

	float u1 = frand();
    float u2 = frand();

    float t = sqrt(-2.0f * log(1.0f - u1));

	float z0 = t*cos(two_pi*u2);
	z1 = t*sin(two_pi*u2);

	return z0 * sigma + mu;
}